

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.hpp
# Opt level: O2

duckdb_string
duckdb::
TryCastCInternal<duckdb::hugeint_t,duckdb_string,duckdb::ToCStringCastWrapper<duckdb::StringCast>>
          (duckdb_result *result,idx_t col,idx_t row)

{
  void *pvVar1;
  bool bVar2;
  hugeint_t input;
  duckdb_string result_value;
  duckdb_string local_20;
  
  pvVar1 = result->deprecated_columns[col].deprecated_data;
  input.upper = *(int64_t *)((long)pvVar1 + row * 0x10 + 8);
  input.lower = *(uint64_t *)((long)pvVar1 + row * 0x10);
  bVar2 = ToCStringCastWrapper<duckdb::StringCast>::Operation<duckdb::hugeint_t,duckdb_string>
                    (input,&local_20);
  if (!bVar2) {
    local_20 = FetchDefaultValue::Operation<duckdb_string>();
  }
  return local_20;
}

Assistant:

void *UnsafeFetchPtr(duckdb_result *result, idx_t col, idx_t row) {
	D_ASSERT(row < result->deprecated_row_count);
	return (void *)&(((T *)result->deprecated_columns[col].deprecated_data)[row]);
}